

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O2

void process_una(NMQ *q,uint32_t una)

{
  dlist_s *pdVar1;
  dlist_s *pdVar2;
  
  pdVar2 = (q->snd_buf).next;
  while ((pdVar2 != &q->snd_buf && (pdVar1 = pdVar2 + 2, *(uint *)&pdVar1->next < una))) {
    pdVar2 = pdVar2->next;
    process_ack(q,*(uint *)&pdVar1->next,0);
  }
  update_una(q);
  return;
}

Assistant:

static void process_una(NMQ *q, uint32_t una) {
    dlnode *node = 0, *nxt = 0;
    FOR_EACH(node, nxt, &q->snd_buf) {
        segment *s = ADDRESS_FOR(segment, head, node);
        if (s->sn < una) {
            process_ack(q, s->sn, 0);
        } else {
            break;
        }
    }

    update_una(q);
}